

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

bool Corrade::Utility::Path::make(StringView path)

{
  StringView value;
  StringView value_00;
  StringView a;
  StringView filename;
  StringView path_00;
  bool bVar1;
  int iVar2;
  char *__path;
  int *piVar3;
  Debug *pDVar4;
  undefined8 in_RCX;
  bool bVar6;
  BasicStringView<const_char> path_01;
  StringView SVar7;
  StringView view;
  StringView path_local;
  Error err;
  String pathNullTerminated;
  StringView local_28;
  size_t sVar5;
  
  path_local._sizePlusFlags = path._sizePlusFlags;
  path_local._data = path._data;
  bVar6 = ((undefined1  [16])path & (undefined1  [16])0x3fffffffffffffff) != (undefined1  [16])0x0;
  sVar5 = CONCAT71((int7)((ulong)in_RCX >> 8),bVar6 && path_local._data != (char *)0x0);
  if (!bVar6 || path_local._data == (char *)0x0) {
    return true;
  }
  bVar6 = Containers::BasicStringView<const_char>::hasSuffix(&path_local,'/');
  if (bVar6) {
    path_01 = Containers::BasicStringView<const_char>::exceptSuffix(&path_local,1);
    bVar6 = make(path_01);
    return bVar6;
  }
  SVar7._sizePlusFlags = sVar5;
  SVar7._data = (char *)path_local._sizePlusFlags;
  split((Pair<Corrade::Containers::BasicStringView<const_char>,_Corrade::Containers::BasicStringView<const_char>_>
         *)&err,(Path *)path_local._data,SVar7);
  path_00._sizePlusFlags._0_1_ = err.super_Debug._flags._value;
  path_00._sizePlusFlags._1_1_ = err.super_Debug._immediateFlags._value;
  path_00._sizePlusFlags._2_1_ = err.super_Debug._internalFlags._value;
  path_00._sizePlusFlags._3_1_ = err.super_Debug._previousColor;
  path_00._sizePlusFlags._4_4_ = err.super_Debug._sourceLocationLine;
  path_00._data = (char *)err.super_Debug._output;
  filename._sizePlusFlags._0_1_ = err.super_Debug._flags._value;
  filename._sizePlusFlags._1_1_ = err.super_Debug._immediateFlags._value;
  filename._sizePlusFlags._2_1_ = err.super_Debug._internalFlags._value;
  filename._sizePlusFlags._3_1_ = err.super_Debug._previousColor;
  filename._sizePlusFlags._4_4_ = err.super_Debug._sourceLocationLine;
  filename._data = (char *)err.super_Debug._output;
  a._sizePlusFlags._0_1_ = err.super_Debug._flags._value;
  a._sizePlusFlags._1_1_ = err.super_Debug._immediateFlags._value;
  a._sizePlusFlags._2_1_ = err.super_Debug._internalFlags._value;
  a._sizePlusFlags._3_1_ = err.super_Debug._previousColor;
  a._sizePlusFlags._4_4_ = err.super_Debug._sourceLocationLine;
  a._data = (char *)err.super_Debug._output;
  bVar6 = (err.super_Debug._8_8_ & 0x3fffffffffffffff) != 0;
  sVar5 = CONCAT71((int7)(sVar5 >> 8),bVar6 && err.super_Debug._output != (ostream *)0x0);
  if (bVar6 && err.super_Debug._output != (ostream *)0x0) {
    SVar7 = Containers::Literals::StringLiterals::operator____s("/",1);
    sVar5 = SVar7._sizePlusFlags;
    bVar6 = Containers::operator!=(a,SVar7);
    if (((bVar6) && (bVar6 = exists(filename), !bVar6)) && (bVar6 = make(path_00), !bVar6)) {
      return false;
    }
  }
  view._sizePlusFlags = sVar5;
  view._data = (char *)path_local._sizePlusFlags;
  Containers::String::nullTerminatedView(&pathNullTerminated,(String *)path_local._data,view);
  __path = Containers::String::data(&pathNullTerminated);
  iVar2 = mkdir(__path,0x1ff);
  bVar6 = true;
  if (iVar2 != 0) {
    piVar3 = __errno_location();
    if (*piVar3 == 0x11) {
      Containers::BasicStringView<const_char>::BasicStringView<const_char,_0>
                (&local_28,&pathNullTerminated);
      bVar1 = isDirectory(local_28);
      if (bVar1) goto LAB_00151314;
      Error::Error(&err,(Flags)0x0);
      pDVar4 = Debug::operator<<(&err.super_Debug,"Utility::Path::make():");
      value._sizePlusFlags = path_local._sizePlusFlags;
      value._data = path_local._data;
      pDVar4 = Debug::operator<<(pDVar4,value);
      Debug::operator<<(pDVar4,"exists but is not a directory");
    }
    else {
      Error::Error(&err,(Flags)0x0);
      pDVar4 = Debug::operator<<(&err.super_Debug,"Utility::Path::make(): can\'t create");
      value_00._sizePlusFlags = path_local._sizePlusFlags;
      value_00._data = path_local._data;
      pDVar4 = Debug::operator<<(pDVar4,value_00);
      (pDVar4->_immediateFlags)._value = (pDVar4->_immediateFlags)._value | 4;
      Debug::operator<<(pDVar4,":");
      Implementation::printErrnoErrorString(&err.super_Debug,*piVar3);
    }
    Error::~Error(&err);
    bVar6 = false;
  }
LAB_00151314:
  Containers::String::~String(&pathNullTerminated);
  return bVar6;
}

Assistant:

bool make(const Containers::StringView path) {
    if(!path) return true;

    /* If the path contains trailing slash, strip it */
    if(path.hasSuffix('/'))
        return make(path.exceptSuffix(1));

    /* If parent directory doesn't exist, create it. That means two syscalls to
       create each parent (and two null-terminated string allocations on Unix /
       two UTF-16 conversions on Windows). I could also directly call into
       make() without checking exists() first, relying on mkdir() failing with
       EEXIST instead -- while that would save one syscall per path component
       that doesn't exist, for long paths that already exist (which is
       supposedly the more common scenario) it would mean mkdir() gets called
       once for each component instead of just one existence check for the
       parent and one mkdir() for the leaf directory. */
    const Containers::StringView parentPath = split(path).first();
    /* Can't use !isDirectory(parentPath) as it's not reliable on all platforms
       and could make the function fail even before attempting to create
       anything. With exists() the error message is slightly shittier if the
       parentPath is a file, but at least it doesn't fail. See the other use of
       isDirectory() below for more details. */
    if(parentPath && parentPath != "/"_s && !exists(parentPath) && !make(parentPath))
        return false;

    /* Create the leaf directory, return true if successfully created */
    #if defined(CORRADE_TARGET_UNIX) || defined(CORRADE_TARGET_EMSCRIPTEN) || (defined(CORRADE_TARGET_WINDOWS) && !defined(CORRADE_TARGET_WINDOWS_RT))
    #if defined(CORRADE_TARGET_UNIX) || defined(CORRADE_TARGET_EMSCRIPTEN)
    const Containers::String pathNullTerminated = Containers::String::nullTerminatedView(path);
    #elif defined(CORRADE_TARGET_WINDOWS) && !defined(CORRADE_TARGET_WINDOWS_RT)
    const Containers::Array<wchar_t> pathWide = Unicode::widen(path);
    #else
    #error
    #endif
    if(
        /* Unix, Emscripten */
        #if defined(CORRADE_TARGET_UNIX) || defined(CORRADE_TARGET_EMSCRIPTEN)
        mkdir(pathNullTerminated.data(), 0777) == 0
        /* Windows (not Store/Phone) */
        #elif defined(CORRADE_TARGET_WINDOWS) && !defined(CORRADE_TARGET_WINDOWS_RT)
        CreateDirectoryW(pathWide.data(), nullptr) != 0
        #else
        #error
        #endif
    )
        return true;

    /* If already exists, return false if it's not a directory */
    if(
        /* Unix, Emscripten */
        #if defined(CORRADE_TARGET_UNIX) || defined(CORRADE_TARGET_EMSCRIPTEN)
        errno == EEXIST
        /* Windows (not Store/Phone) */
        #elif defined(CORRADE_TARGET_WINDOWS) && !defined(CORRADE_TARGET_WINDOWS_RT)
        GetLastError() == ERROR_ALREADY_EXISTS
        #else
        #error
        #endif
    ) {
        /* isDirectory() is known to work correctly only on Unix and
           Emscripten, not on iOS, and on Windows only partially, see the
           comments in the implementation above. The main goal is to have
           Path::make() work correctly in the happy cases, i.e. have it create
           the path if at all possible, and return true. In comparison, having
           it return `false` if the path exists but is a file, is only a
           nice-to-have behavior for rare scenarios. So skipping this extra
           check on platforms that can't detect a directory properly (and thus
           silently returning true even if the existing path may not be a
           directory) is not that of a big deal compared to failing always. */
        #if (defined(CORRADE_TARGET_WINDOWS) && !defined(CORRADE_TARGET_WINDOWS_RT)) || ((defined(CORRADE_TARGET_UNIX) || defined(CORRADE_TARGET_EMSCRIPTEN)) && !defined(CORRADE_TARGET_IOS))
        #if defined(CORRADE_TARGET_WINDOWS) && !defined(CORRADE_TARGET_WINDOWS_RT)
        const DWORD fileAttributes = GetFileAttributesW(pathWide);
        #endif
        if(
            /* On iOS (Simulator at least) stat() is a no-op, returning random
               values, thus isDirectory() returns false for it */
            #if (defined(CORRADE_TARGET_UNIX) || defined(CORRADE_TARGET_EMSCRIPTEN)) && !defined(CORRADE_TARGET_IOS)
            !isDirectory(pathNullTerminated)
            /* On Windows isDirectory() doesn't treat symlinks properly yet,
               as a workaround we treat symlinks as "may be a directory as
               well" to not have a failure in case the path exists and is a
               symlink to a directory. Furthermore, INVALID_FILE_ATTRIBUTES
               contain the FILE_ATTRIBUTE_DIRECTORY bit for some reason -- so
               if it wouldn't check for INVALID_FILE_ATTRIBUTES first, files
               that fail to query would still be treated as "fine, it's a
               directory". */
            #elif defined(CORRADE_TARGET_WINDOWS) && !defined(CORRADE_TARGET_WINDOWS_RT)
            fileAttributes != INVALID_FILE_ATTRIBUTES &&
                /* No idea what a "directory reparse point" is, but
                    https://learn.microsoft.com/en-us/windows/win32/fileio/file-attribute-constants
                   says it's set for symlinks as well */
                !(fileAttributes & FILE_ATTRIBUTE_REPARSE_POINT) &&
                !(fileAttributes & FILE_ATTRIBUTE_DIRECTORY)
            #else
            #error
            #endif
        ) {
            Error{} << "Utility::Path::make():" << path << "exists but is not a directory";
            return false;
        }
        #endif

        return true;
    }

    Error err;
    err << "Utility::Path::make(): can't create" << path << Debug::nospace << ":";
    #if defined(CORRADE_TARGET_UNIX) || defined(CORRADE_TARGET_EMSCRIPTEN)
    Utility::Implementation::printErrnoErrorString(err, errno);
    #elif defined(CORRADE_TARGET_WINDOWS) && !defined(CORRADE_TARGET_WINDOWS_RT)
    Utility::Implementation::printWindowsErrorString(err, GetLastError());
    #else
    #error
    #endif
    return false;
    #else
    Error{} << "Utility::Path::make(): not implemented on this platform";
    return false;
    #endif
}